

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptorProto::MergeFrom(EnumValueDescriptorProto *this,Message *from)

{
  EnumValueDescriptorProto *pEVar1;
  EnumValueDescriptorProto *in_RDI;
  EnumValueDescriptorProto *unaff_retaddr;
  EnumValueDescriptorProto *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pEVar1 = DynamicCastToGenerated<google::protobuf::EnumValueDescriptorProto>
                     (&in_RDI->super_Message);
  if (pEVar1 == (EnumValueDescriptorProto *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void EnumValueDescriptorProto::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.EnumValueDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  const EnumValueDescriptorProto* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<EnumValueDescriptorProto>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.EnumValueDescriptorProto)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.EnumValueDescriptorProto)
    MergeFrom(*source);
  }
}